

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

size_t units::findWordOperatorSep(string *ustring,string *keyword)

{
  bool bVar1;
  size_t sVar2;
  char closeSegment;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  byte *pbVar6;
  size_type __pos;
  int index;
  int local_3c;
  size_t local_38;
  
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                    (ustring,(keyword->_M_dataplus)._M_p,0xffffffffffffffff,
                     keyword->_M_string_length);
  sVar5 = sVar3;
  if (keyword->_M_string_length + sVar3 + 1 < ustring->_M_string_length) {
    pbVar6 = (byte *)((ustring->_M_dataplus)._M_p + keyword->_M_string_length + sVar3);
    while ((((sVar5 = sVar3, *pbVar6 - 0x2a < 0x35 &&
             ((0x10000000000021U >> ((ulong)(*pbVar6 - 0x2a) & 0x3f) & 1) != 0)) &&
            (sVar5 = 0xffffffffffffffff, sVar3 != 0)) &&
           (sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::rfind(ustring,(keyword->_M_dataplus)._M_p,sVar3 - 1,keyword->_M_string_length)
           , sVar3 != 0xffffffffffffffff))) {
      pbVar6 = (byte *)((ustring->_M_dataplus)._M_p + keyword->_M_string_length + sVar3);
    }
  }
  sVar3 = ustring->_M_string_length;
  do {
    if (sVar5 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_last_of(ustring,")}]",sVar3,3);
    bVar1 = false;
    __pos = sVar3;
    sVar2 = sVar5;
    if ((sVar4 != 0xffffffffffffffff) && (sVar5 <= sVar4)) {
      closeSegment = getMatchCharacter((ustring->_M_dataplus)._M_p[sVar4]);
      local_3c = (int)sVar4 + -2;
      segmentcheckReverse(ustring,closeSegment,&local_3c);
      __pos = (size_type)local_3c;
      bVar1 = (long)__pos >= 0;
      if ((long)__pos < 0) {
        local_38 = 0xffffffffffffffff;
        __pos = sVar3;
        sVar2 = local_38;
      }
      else {
        sVar2 = local_38;
        if (__pos < sVar5) {
          sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  rfind(ustring,(keyword->_M_dataplus)._M_p,__pos,keyword->_M_string_length);
          sVar2 = local_38;
        }
      }
    }
    local_38 = sVar2;
    sVar3 = __pos;
  } while (bVar1);
  return local_38;
}

Assistant:

static size_t
    findWordOperatorSep(const std::string& ustring, const std::string& keyword)
{
    auto sep = ustring.rfind(keyword);
    if (ustring.size() > sep + keyword.size() + 1) {
        auto keychar = ustring[sep + keyword.size()];
        while (keychar == '^' || keychar == '*' || keychar == '/') {
            if (sep == 0) {
                sep = std::string::npos;
                break;
            }
            sep = ustring.rfind(keyword, sep - 1);
            if (sep == std::string::npos) {
                break;
            }
            keychar = ustring[sep + keyword.size()];
        }
    }
    size_t findex = ustring.size();
    while (sep != std::string::npos) {
        auto lbrack = ustring.find_last_of(")}]", findex);

        if (lbrack == std::string::npos) {
            return sep;
        }
        if (lbrack < sep) {
            // this should not happen as it would mean the operator separator
            // didn't function properly
            return sep;  // LCOV_EXCL_LINE
        }
        auto cchar = getMatchCharacter(ustring[lbrack]);
        --lbrack;
        int index = static_cast<int>(lbrack) - 1;
        segmentcheckReverse(ustring, cchar, index);
        if (index < 0) {
            // this should not happen as it would mean we got this point by
            // bypassing some other checks
            return std::string::npos;  // LCOV_EXCL_LINE
        }
        findex = static_cast<size_t>(index);
        if (findex < sep) {
            sep = ustring.rfind(keyword, findex);
        }
    }
    return sep;
}